

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EDCircles.cpp
# Opt level: O3

void EDCircles::ComputeEllipsePoints(double *pvec,double *px,double *py,int noPoints)

{
  size_t __n;
  double dVar1;
  double dVar2;
  double *pdVar3;
  double *pdVar4;
  double *pdVar5;
  double *pdVar6;
  double *pdVar7;
  double *pdVar8;
  double *pdVar9;
  double *pdVar10;
  double *pdVar11;
  double *pdVar12;
  int p;
  double **m;
  double **m_00;
  double **m_01;
  double **m_02;
  double **m_03;
  double **m_04;
  double **m_05;
  double **m_06;
  void *__s;
  double **m_07;
  double **TB;
  double **InvB;
  double **m_08;
  double **m_09;
  double **m_10;
  long lVar13;
  uint noColumns;
  ulong uVar14;
  long lVar15;
  ulong uVar16;
  long lVar17;
  uint uVar18;
  double dVar20;
  double dVar21;
  double dVar22;
  ulong uVar19;
  
  uVar18 = noPoints >> 1;
  uVar19 = (ulong)uVar18;
  noColumns = uVar18 + 1;
  m = AllocateMatrix(3,noColumns);
  m_00 = AllocateMatrix(3,noColumns);
  m_01 = AllocateMatrix(3,noColumns);
  m_02 = AllocateMatrix(3,noColumns);
  m_03 = AllocateMatrix(3,noColumns);
  m_04 = AllocateMatrix(3,noColumns);
  m_05 = AllocateMatrix(3,noColumns);
  m_06 = AllocateMatrix(3,noColumns);
  __n = (long)(int)uVar18 * 8 + 8;
  uVar16 = 0xffffffffffffffff;
  if (-4 < (int)(noPoints & 0xfffffffeU)) {
    uVar16 = __n;
  }
  __s = operator_new__(uVar16);
  m_07 = AllocateMatrix(3,noColumns);
  TB = AllocateMatrix(3,3);
  InvB = AllocateMatrix(3,3);
  m_08 = AllocateMatrix(3,2);
  m_09 = AllocateMatrix(3,2);
  m_10 = AllocateMatrix(2,2);
  memset(__s,0,__n);
  dVar22 = pvec[6];
  dVar20 = pvec[4];
  dVar21 = pvec[5];
  dVar1 = pvec[3];
  dVar2 = pvec[2];
  pdVar3 = TB[1];
  pdVar3[1] = pvec[1];
  pdVar3[2] = dVar2 * 0.5;
  pdVar3 = TB[2];
  pdVar3[1] = dVar2 * 0.5;
  pdVar3[2] = dVar1;
  pdVar3 = m_09[1];
  pdVar3[1] = dVar20;
  pdVar4 = m_09[2];
  pdVar4[1] = dVar21;
  uVar16 = (ulong)noColumns;
  if (0 < (int)uVar18) {
    pdVar5 = m[1];
    pdVar6 = m[2];
    dVar20 = 0.0;
    uVar14 = 1;
    do {
      dVar21 = cos(dVar20);
      pdVar5[uVar14] = dVar21;
      dVar21 = sin(dVar20);
      pdVar6[uVar14] = dVar21;
      uVar14 = uVar14 + 1;
      dVar20 = dVar20 + 3.14781 / (double)(int)uVar18;
    } while (uVar16 != uVar14);
  }
  inverse(TB,InvB,2);
  lVar13 = 1;
  do {
    pdVar5 = m_08[lVar13];
    pdVar6 = InvB[lVar13];
    pdVar5[1] = 0.0;
    dVar20 = 0.0;
    lVar15 = 1;
    do {
      dVar20 = dVar20 + pdVar6[lVar15] * m_09[lVar15][1];
      pdVar5[1] = dVar20;
      lVar15 = lVar15 + 1;
    } while (lVar15 != 3);
    lVar13 = lVar13 + 1;
  } while (lVar13 != 3);
  pdVar5 = m_10[1];
  pdVar5[1] = 0.0;
  dVar20 = 0.0;
  lVar13 = 1;
  do {
    dVar20 = dVar20 + m_09[lVar13][1] * m_08[lVar13][1];
    pdVar5[1] = dVar20;
    lVar13 = lVar13 + 1;
  } while (lVar13 != 3);
  pdVar5[1] = dVar22 * -4.0 + dVar20;
  lVar13 = 1;
  do {
    if (0 < (int)uVar18) {
      pdVar6 = m_00[lVar13];
      pdVar7 = InvB[lVar13];
      uVar14 = 1;
      do {
        pdVar6[uVar14] = 0.0;
        dVar22 = 0.0;
        lVar15 = 0;
        do {
          dVar22 = dVar22 + pdVar7[lVar15 + 1] * m[lVar15 + 1][uVar14];
          pdVar6[uVar14] = dVar22;
          lVar15 = lVar15 + 1;
        } while (lVar15 != 2);
        uVar14 = uVar14 + 1;
      } while (uVar14 != uVar16);
    }
    lVar13 = lVar13 + 1;
  } while (lVar13 != 3);
  lVar13 = 1;
  do {
    while ((int)uVar18 < 1) {
      lVar13 = lVar13 + 1;
      if (lVar13 == 3) goto LAB_001122a7;
    }
    pdVar6 = m[lVar13];
    pdVar7 = m_00[lVar13];
    pdVar8 = m_07[lVar13];
    uVar14 = 1;
    do {
      pdVar8[uVar14] = pdVar6[uVar14] * pdVar7[uVar14];
      uVar14 = uVar14 + 1;
    } while (uVar16 != uVar14);
    lVar13 = lVar13 + 1;
  } while (lVar13 != 3);
  if (0 < (int)uVar18) {
    pdVar6 = m_07[1];
    pdVar7 = m_07[2];
    uVar14 = 1;
    do {
      dVar22 = pdVar5[1] / (pdVar6[uVar14] + pdVar7[uVar14]);
      dVar20 = -1.0;
      if (dVar22 >= 0.0) {
        if (dVar22 < 0.0) {
          dVar20 = sqrt(dVar22);
        }
        else {
          dVar20 = SQRT(dVar22);
        }
      }
      *(double *)((long)__s + uVar14 * 8) = dVar20;
      uVar14 = uVar14 + 1;
    } while (uVar16 != uVar14);
    if (0 < (int)uVar18) {
      pdVar5 = m_01[1];
      pdVar6 = m_01[2];
      uVar14 = 1;
      do {
        dVar22 = *(double *)((long)__s + uVar14 * 8);
        pdVar6[uVar14] = dVar22;
        pdVar5[uVar14] = dVar22;
        uVar14 = uVar14 + 1;
      } while (uVar16 != uVar14);
      if (0 < (int)uVar18) {
        pdVar5 = m_02[1];
        pdVar6 = m_02[2];
        uVar14 = 1;
        do {
          pdVar5[uVar14] = pdVar3[1];
          pdVar6[uVar14] = pdVar4[1];
          uVar14 = uVar14 + 1;
        } while (uVar16 != uVar14);
        if (0 < (int)uVar18) {
          pdVar3 = m_01[1];
          pdVar4 = m_01[2];
          pdVar5 = m[1];
          pdVar6 = m[2];
          pdVar7 = m_02[1];
          pdVar8 = m_02[2];
          pdVar9 = m_05[1];
          pdVar10 = m_05[2];
          pdVar11 = m_06[1];
          pdVar12 = m_06[2];
          lVar13 = 0;
          do {
            *(double *)((long)pdVar9 + lVar13 + 8) =
                 (*(double *)((long)pdVar3 + lVar13 + 8) * *(double *)((long)pdVar5 + lVar13 + 8) -
                 *(double *)((long)pdVar7 + lVar13 + 8)) * 0.5;
            *(double *)((long)pdVar10 + lVar13 + 8) =
                 (*(double *)((long)pdVar4 + lVar13 + 8) * *(double *)((long)pdVar6 + lVar13 + 8) -
                 *(double *)((long)pdVar8 + lVar13 + 8)) * 0.5;
            *(double *)((long)pdVar11 + lVar13 + 8) =
                 (-*(double *)((long)pdVar3 + lVar13 + 8) * *(double *)((long)pdVar5 + lVar13 + 8) -
                 *(double *)((long)pdVar7 + lVar13 + 8)) * 0.5;
            *(double *)((long)pdVar12 + lVar13 + 8) =
                 (-*(double *)((long)pdVar4 + lVar13 + 8) * *(double *)((long)pdVar6 + lVar13 + 8) -
                 *(double *)((long)pdVar8 + lVar13 + 8)) * 0.5;
            lVar13 = lVar13 + 8;
          } while (uVar16 * 8 + -8 != lVar13);
        }
      }
    }
  }
LAB_001122a7:
  lVar13 = 1;
  do {
    if (0 < (int)uVar18) {
      pdVar3 = m_03[lVar13];
      pdVar4 = InvB[lVar13];
      uVar14 = 1;
      do {
        pdVar3[uVar14] = 0.0;
        dVar22 = 0.0;
        lVar15 = 0;
        do {
          dVar22 = dVar22 + pdVar4[lVar15 + 1] * m_05[lVar15 + 1][uVar14];
          pdVar3[uVar14] = dVar22;
          lVar15 = lVar15 + 1;
        } while (lVar15 != 2);
        uVar14 = uVar14 + 1;
      } while (uVar14 != uVar16);
    }
    lVar13 = lVar13 + 1;
  } while (lVar13 != 3);
  lVar13 = 1;
  do {
    while ((int)uVar18 < 1) {
      lVar13 = lVar13 + 1;
      if (lVar13 == 3) {
LAB_0011244d:
        DeallocateMatrix(m,3);
        DeallocateMatrix(m_00,3);
        DeallocateMatrix(m_01,3);
        DeallocateMatrix(m_02,3);
        DeallocateMatrix(m_03,3);
        DeallocateMatrix(m_04,3);
        DeallocateMatrix(m_05,3);
        DeallocateMatrix(m_06,3);
        operator_delete__(__s);
        DeallocateMatrix(m_07,3);
        DeallocateMatrix(TB,3);
        DeallocateMatrix(InvB,3);
        DeallocateMatrix(m_08,3);
        DeallocateMatrix(m_09,3);
        DeallocateMatrix(m_10,2);
        return;
      }
    }
    pdVar3 = m_04[lVar13];
    pdVar4 = InvB[lVar13];
    uVar14 = 1;
    do {
      pdVar3[uVar14] = 0.0;
      dVar22 = 0.0;
      lVar15 = 0;
      do {
        dVar22 = dVar22 + pdVar4[lVar15 + 1] * m_06[lVar15 + 1][uVar14];
        pdVar3[uVar14] = dVar22;
        lVar15 = lVar15 + 1;
      } while (lVar15 != 2);
      uVar14 = uVar14 + 1;
    } while (uVar14 != uVar16);
    lVar13 = lVar13 + 1;
  } while (lVar13 != 3);
  if (0 < (int)uVar18) {
    lVar13 = 1;
    lVar15 = 0;
    do {
      dVar22 = *(double *)((long)__s + lVar15 * 8 + 8);
      if ((dVar22 != -1.0) || (NAN(dVar22))) {
        px[lVar15] = m_03[1][lVar15 + 1];
        py[lVar15] = m_03[2][lVar15 + 1];
        lVar17 = uVar19 + lVar15;
        px[uVar19 + lVar15] = m_04[1][lVar15 + 1];
        dVar22 = m_04[2][lVar15 + 1];
      }
      else {
        px[lVar15] = -1.0;
        py[lVar15] = -1.0;
        lVar17 = lVar13 + uVar19 + -1;
        px[uVar19 + lVar15] = -1.0;
        dVar22 = -1.0;
      }
      py[lVar17] = dVar22;
      lVar13 = lVar13 + 1;
      lVar15 = lVar15 + 1;
    } while (uVar16 - 1 != lVar15);
  }
  goto LAB_0011244d;
}

Assistant:

void EDCircles::ComputeEllipsePoints(double * pvec, double * px, double * py, int noPoints)
{
	if (noPoints % 2) noPoints--;
	int npts = noPoints / 2;

	double **u = AllocateMatrix(3, npts + 1);
	double **Aiu = AllocateMatrix(3, npts + 1);
	double **L = AllocateMatrix(3, npts + 1);
	double **B = AllocateMatrix(3, npts + 1);
	double **Xpos = AllocateMatrix(3, npts + 1);
	double **Xneg = AllocateMatrix(3, npts + 1);
	double **ss1 = AllocateMatrix(3, npts + 1);
	double **ss2 = AllocateMatrix(3, npts + 1);
	double *lambda = new double[npts + 1];
	double **uAiu = AllocateMatrix(3, npts + 1);
	double **A = AllocateMatrix(3, 3);
	double **Ai = AllocateMatrix(3, 3);
	double **Aib = AllocateMatrix(3, 2);
	double **b = AllocateMatrix(3, 2);
	double **r1 = AllocateMatrix(2, 2);
	double Ao, Ax, Ay, Axx, Ayy, Axy;

	double pi = 3.14781;
	double theta;
	int i;
	int j;
	double kk;

	memset(lambda, 0, sizeof(double)*(npts + 1));

	Ao = pvec[6];
	Ax = pvec[4];
	Ay = pvec[5];
	Axx = pvec[1];
	Ayy = pvec[3];
	Axy = pvec[2];

	A[1][1] = Axx; A[1][2] = Axy / 2;
	A[2][1] = Axy / 2; A[2][2] = Ayy;
	b[1][1] = Ax; b[2][1] = Ay;

	// Generate normals linspace
	for (i = 1, theta = 0.0; i <= npts; i++, theta += (pi / npts))
	{
		u[1][i] = cos(theta);
		u[2][i] = sin(theta);
	}

	inverse(A, Ai, 2);

	AperB(Ai, b, Aib, 2, 2, 2, 1);
	A_TperB(b, Aib, r1, 2, 1, 2, 1);
	r1[1][1] = r1[1][1] - 4 * Ao;

	AperB(Ai, u, Aiu, 2, 2, 2, npts);
	for (i = 1; i <= 2; i++)
		for (j = 1; j <= npts; j++)
			uAiu[i][j] = u[i][j] * Aiu[i][j];

	for (j = 1; j <= npts; j++)
	{
		if ((kk = (r1[1][1] / (uAiu[1][j] + uAiu[2][j]))) >= 0.0)
			lambda[j] = sqrt(kk);
		else
			lambda[j] = -1.0;
	}

	// Builds up B and L
	for (j = 1; j <= npts; j++)
		L[1][j] = L[2][j] = lambda[j];
	for (j = 1; j <= npts; j++)
	{
		B[1][j] = b[1][1];
		B[2][j] = b[2][1];
	}

	for (j = 1; j <= npts; j++)
	{
		ss1[1][j] = 0.5 * (L[1][j] * u[1][j] - B[1][j]);
		ss1[2][j] = 0.5 * (L[2][j] * u[2][j] - B[2][j]);
		ss2[1][j] = 0.5 * (-L[1][j] * u[1][j] - B[1][j]);
		ss2[2][j] = 0.5 * (-L[2][j] * u[2][j] - B[2][j]);
	}

	AperB(Ai, ss1, Xpos, 2, 2, 2, npts);
	AperB(Ai, ss2, Xneg, 2, 2, 2, npts);

	for (j = 1; j <= npts; j++)
	{
		if (lambda[j] == -1.0)
		{
			px[j - 1] = -1;
			py[j - 1] = -1;
			px[j - 1 + npts] = -1;
			py[j - 1 + npts] = -1;
		}
		else
		{
			px[j - 1] = Xpos[1][j];
			py[j - 1] = Xpos[2][j];
			px[j - 1 + npts] = Xneg[1][j];
			py[j - 1 + npts] = Xneg[2][j];
		}
	}

	DeallocateMatrix(u, 3);
	DeallocateMatrix(Aiu, 3);
	DeallocateMatrix(L, 3);
	DeallocateMatrix(B, 3);
	DeallocateMatrix(Xpos, 3);
	DeallocateMatrix(Xneg, 3);
	DeallocateMatrix(ss1, 3);
	DeallocateMatrix(ss2, 3);
	delete[] lambda;
	DeallocateMatrix(uAiu, 3);
	DeallocateMatrix(A, 3);
	DeallocateMatrix(Ai, 3);
	DeallocateMatrix(Aib, 3);
	DeallocateMatrix(b, 3);
	DeallocateMatrix(r1, 2);
}